

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_exception.cc
# Opt level: O3

void __thiscall ExceptionIDNotFound::ExceptionIDNotFound(ExceptionIDNotFound *this,ID *id)

{
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  Exception::Exception(&this->super_Exception,&id->super_Object,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  this->id_ = id;
  strfmt_abi_cxx11_(&local_60,"`%s\' undeclared",(id->name)._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)this,(ulong)local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ExceptionIDNotFound::ExceptionIDNotFound(const ID* id) : Exception(id), id_(id)
	{
	append(strfmt("`%s' undeclared", id_->Name()));
	}